

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O2

void aom_comp_mask_upsampled_pred
               (MACROBLOCKD *xd,AV1_COMMON *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred,
               uint8_t *pred,int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref,
               int ref_stride,uint8_t *mask,int mask_stride,int invert_mask,int subpel_search)

{
  if (subpel_y_q3 != 0 || subpel_x_q3 != 0) {
    aom_upsampled_pred_sse2
              (xd,cm,mi_row,mi_col,mv,comp_pred,width,height,subpel_x_q3,subpel_y_q3,ref,ref_stride,
               subpel_search);
    ref = comp_pred;
    ref_stride = width;
  }
  (*aom_comp_mask_pred)(comp_pred,pred,width,height,ref,ref_stride,mask,mask_stride,invert_mask);
  return;
}

Assistant:

void aom_comp_mask_upsampled_pred(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                                  int mi_row, int mi_col, const MV *const mv,
                                  uint8_t *comp_pred, const uint8_t *pred,
                                  int width, int height, int subpel_x_q3,
                                  int subpel_y_q3, const uint8_t *ref,
                                  int ref_stride, const uint8_t *mask,
                                  int mask_stride, int invert_mask,
                                  int subpel_search) {
  if (subpel_x_q3 | subpel_y_q3) {
    aom_upsampled_pred(xd, cm, mi_row, mi_col, mv, comp_pred, width, height,
                       subpel_x_q3, subpel_y_q3, ref, ref_stride,
                       subpel_search);
    ref = comp_pred;
    ref_stride = width;
  }
  aom_comp_mask_pred(comp_pred, pred, width, height, ref, ref_stride, mask,
                     mask_stride, invert_mask);
}